

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

_Bool testbinaryfuse16(size_t size,size_t repeated_size)

{
  undefined1 auVar1 [16];
  _Bool _Var2;
  uint uVar3;
  uint64_t *keys;
  uint64_t uVar4;
  uint32_t size_00;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  binary_fuse16_t local_58;
  long lVar12;
  
  iVar5 = 0;
  printf("testing binary fuse16 with size %zu and %zu duplicates\n",size,repeated_size);
  size_00 = (uint32_t)size;
  local_58.Size = size_00;
  if (size_00 == 0) {
    local_58.SegmentLength = 4;
    local_58.SegmentLengthMask = 3;
    uVar6 = 4;
  }
  else {
    dVar8 = (double)(size & 0xffffffff);
    dVar9 = log(dVar8);
    dVar9 = floor(dVar9 / 1.2029723039923526 + 2.25);
    uVar6 = 0x40000;
    if ((uint)(long)dVar9 < 0x13) {
      uVar6 = 1 << ((byte)(long)dVar9 & 0x1f);
    }
    local_58.SegmentLengthMask = uVar6 - 1;
    local_58.SegmentLength = uVar6;
    if (size_00 != 1) {
      dVar9 = log(dVar8);
      dVar9 = 3.4538776394910684 / dVar9 + 0.875;
      if (dVar9 <= 1.125) {
        dVar9 = 1.125;
      }
      dVar8 = round(dVar9 * dVar8);
      iVar5 = (int)(long)dVar8;
    }
  }
  uVar3 = (uVar6 + iVar5) - 1;
  uVar3 = (uVar3 + uVar6 + ~(uVar6 - 1 & uVar3)) / uVar6;
  local_58.SegmentCount = 1;
  if (2 < uVar3) {
    local_58.SegmentCount = uVar3 - 2;
  }
  local_58.ArrayLength = (local_58.SegmentCount + 2) * uVar6;
  local_58.SegmentCountLength = local_58.SegmentCount * uVar6;
  local_58.Fingerprints = (uint16_t *)calloc((ulong)local_58.ArrayLength,2);
  keys = (uint64_t *)malloc(size * 8);
  auVar1 = _DAT_00109070;
  if (size != 0) {
    lVar12 = size - 1;
    auVar10._8_4_ = (int)lVar12;
    auVar10._0_8_ = lVar12;
    auVar10._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar4 = 0;
    auVar10 = auVar10 ^ _DAT_00109070;
    auVar11 = _DAT_00109060;
    do {
      auVar13 = auVar11 ^ auVar1;
      if ((bool)(~(auVar13._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar13._0_4_ ||
                  auVar10._4_4_ < auVar13._4_4_) & 1)) {
        keys[uVar4] = uVar4;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        keys[uVar4 + 1] = uVar4 + 1;
      }
      uVar4 = uVar4 + 2;
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
    } while ((size + 1 & 0xfffffffffffffffe) != uVar4);
  }
  _Var2 = binary_fuse16_populate(keys,size_00,&local_58);
  if (_Var2) {
    free(keys);
    uVar7 = (ulong)local_58.Size;
    free(local_58.Fingerprints);
    if (uVar7 == size) {
      local_58.SegmentLengthMask = 0;
      local_58.SegmentCount = 0;
      local_58.SegmentCountLength = 0;
      local_58.ArrayLength = 0;
      local_58.Seed = 0;
      local_58.Size = 0;
      local_58.SegmentLength = 0;
      local_58.Fingerprints = (uint16_t *)0x0;
      _Var2 = test(size,repeated_size,&local_58,binary_fuse16_allocate_gen,binary_fuse16_free_gen,
                   binary_fuse16_size_in_bytes_gen,binary_fuse16_serialization_bytes_gen,
                   binary_fuse16_serialize_gen,binary_fuse16_deserialize_gen,
                   binary_fuse16_populate_gen,binary_fuse16_contain_gen);
    }
    else {
      _Var2 = false;
      printf("size not (de-)serialized correctly, found %d, expected %zu.",uVar7,size);
    }
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool testbinaryfuse16(size_t size, size_t repeated_size) {
  printf("testing binary fuse16 with size %zu and %zu duplicates\n", size, repeated_size);
  binary_fuse16_t filter;

  // size serialization test
  binary_fuse16_allocate((uint32_t)size, &filter);
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  for (size_t i = 0; i < size; i++) {
    big_set[i] = i;
  }
  if (!binary_fuse16_populate(big_set, (uint32_t)size, &filter)) {
    return false;
  }
  free(big_set);

  size_t buffer_size = binary_fuse16_serialization_bytes(&filter);
  char *buffer = (char *)malloc(buffer_size);
  binary_fuse16_serialize(&filter, buffer);
  binary_fuse16_free(&filter);
  binary_fuse16_deserialize(&filter, buffer);

  if (filter.Size != size) {
    printf("size not (de-)serialized correctly, found %d, expected %zu.",
           filter.Size, size);
    free(buffer);
    binary_fuse16_free(&filter);
    return false;
  }

  free(buffer);
  binary_fuse16_free(&filter);
  // end of size serialization test

  return test(size, repeated_size, &filter,
              binary_fuse16_allocate_gen,
              binary_fuse16_free_gen,
              binary_fuse16_size_in_bytes_gen,
              binary_fuse16_serialization_bytes_gen,
              binary_fuse16_serialize_gen,
              binary_fuse16_deserialize_gen,
              binary_fuse16_populate_gen,
              binary_fuse16_contain_gen);
}